

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

Property soul::heart::ProcessorProperty::getPropertyFromName(string *name)

{
  bool bVar1;
  Property PVar2;
  
  bVar1 = std::operator==(name,"period");
  if (bVar1) {
    PVar2 = period;
  }
  else {
    bVar1 = std::operator==(name,"frequency");
    if (bVar1) {
      PVar2 = frequency;
    }
    else {
      bVar1 = std::operator==(name,"id");
      if (bVar1) {
        PVar2 = id;
      }
      else {
        bVar1 = std::operator==(name,"session");
        if (bVar1) {
          PVar2 = session;
        }
        else {
          bVar1 = std::operator==(name,"latency");
          PVar2 = (uint)bVar1 + (uint)bVar1 * 4;
        }
      }
    }
  }
  return PVar2;
}

Assistant:

static Property getPropertyFromName (const std::string& name)
        {
            if (name == "period")     return Property::period;
            if (name == "frequency")  return Property::frequency;
            if (name == "id")         return Property::id;
            if (name == "session")    return Property::session;
            if (name == "latency")    return Property::latency;

            return Property::none;
        }